

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * format_int(char *t,int64_t i)

{
  char *pcVar1;
  uint64_t local_20;
  uint64_t ui;
  int64_t i_local;
  char *t_local;
  
  ui = i;
  pcVar1 = t;
  if (i < 0) {
    if (i == -0x8000000000000000) {
      local_20 = 0x8000000000000000;
    }
    else {
      local_20 = -i;
    }
    ui = local_20;
    pcVar1 = t;
  }
  do {
    t_local = pcVar1;
    t_local[-1] = "0123456789"[ui % 10];
    ui = ui / 10;
    pcVar1 = t_local + -1;
  } while (ui != 0);
  if (i < 0) {
    t_local[-2] = '-';
    pcVar1 = t_local + -2;
  }
  t_local = pcVar1;
  return t_local;
}

Assistant:

static char *
format_int(char *t, int64_t i)
{
	uint64_t ui;

	if (i < 0) 
		ui = (i == INT64_MIN) ? (uint64_t)(INT64_MAX) + 1 : (uint64_t)(-i);
	else
		ui = i;

	do {
		*--t = "0123456789"[ui % 10];
	} while (ui /= 10);
	if (i < 0)
		*--t = '-';
	return (t);
}